

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int session_inflate_handle_invalid_connection
              (nghttp2_session *session,nghttp2_frame *frame,int lib_error_code,char *reason)

{
  int iVar1;
  
  iVar1 = session_handle_invalid_connection(session,frame,lib_error_code,reason);
  if (-0x385 < iVar1) {
    iVar1 = -0x67;
  }
  return iVar1;
}

Assistant:

static int session_inflate_handle_invalid_connection(nghttp2_session *session,
                                                     nghttp2_frame *frame,
                                                     int lib_error_code,
                                                     const char *reason) {
  int rv;
  rv =
      session_handle_invalid_connection(session, frame, lib_error_code, reason);
  if (nghttp2_is_fatal(rv)) {
    return rv;
  }
  return NGHTTP2_ERR_IGN_HEADER_BLOCK;
}